

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_mvl.c
# Opt level: O1

void * MVL_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  bool bVar1;
  int iVar2;
  void *opaque;
  void *pvVar3;
  uint uVar4;
  PHYSFS_ErrorCode errcode;
  PHYSFS_uint32 PVar5;
  PHYSFS_uint32 count;
  PHYSFS_uint32 size;
  PHYSFS_uint8 buf [4];
  PHYSFS_uint32 local_4c;
  PHYSFS_uint32 local_48;
  int local_41;
  char local_3d [12];
  undefined1 local_31;
  
  local_4c = 0;
  if (io == (PHYSFS_Io *)0x0) {
    __assert_fail("io != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/icculus[P]physfs/src/physfs_archiver_mvl.c"
                  ,0x3f,"void *MVL_openArchive(PHYSFS_Io *, const char *, int, int *)");
  }
  if (forWriting == 0) {
    iVar2 = __PHYSFS_readAll(io,&local_41,4);
    if (iVar2 == 0) {
      return (void *)0x0;
    }
    if (local_41 == 0x4c564d44) {
      *claimed = 1;
      iVar2 = __PHYSFS_readAll(io,&local_4c,4);
      if (iVar2 == 0) {
        return (void *)0x0;
      }
      local_4c = PHYSFS_swapULE32(local_4c);
      opaque = UNPK_openArchive(io,0,1);
      if (opaque == (void *)0x0) {
        return (void *)0x0;
      }
      if (local_4c == 0) {
        return opaque;
      }
      uVar4 = local_4c * 0x11 + 8;
      PVar5 = local_4c;
      while( true ) {
        iVar2 = __PHYSFS_readAll(io,local_3d,0xd);
        if ((iVar2 == 0) || (iVar2 = __PHYSFS_readAll(io,&local_48,4), iVar2 == 0)) {
          bVar1 = false;
        }
        else {
          local_31 = 0;
          local_48 = PHYSFS_swapULE32(local_48);
          bVar1 = false;
          pvVar3 = UNPK_addEntry(opaque,local_3d,0,-1,-1,(ulong)uVar4,(ulong)local_48);
          if (pvVar3 != (void *)0x0) {
            uVar4 = uVar4 + local_48;
            bVar1 = true;
          }
        }
        if (!bVar1) break;
        PVar5 = PVar5 - 1;
        if (PVar5 == 0) {
          return opaque;
        }
      }
      UNPK_abandonArchive(opaque);
      return (void *)0x0;
    }
    errcode = PHYSFS_ERR_UNSUPPORTED;
  }
  else {
    errcode = PHYSFS_ERR_READ_ONLY;
  }
  PHYSFS_setErrorCode(errcode);
  return (void *)0x0;
}

Assistant:

static void *MVL_openArchive(PHYSFS_Io *io, const char *name,
                             int forWriting, int *claimed)
{
    PHYSFS_uint8 buf[4];
    PHYSFS_uint32 count = 0;
    void *unpkarc;

    assert(io != NULL);  /* shouldn't ever happen. */
    BAIL_IF(forWriting, PHYSFS_ERR_READ_ONLY, NULL);
    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, buf, 4), NULL);
    BAIL_IF(memcmp(buf, "DMVL", 4) != 0, PHYSFS_ERR_UNSUPPORTED, NULL);

    *claimed = 1;

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &count, sizeof(count)), NULL);
    count = PHYSFS_swapULE32(count);

    unpkarc = UNPK_openArchive(io, 0, 1);
    BAIL_IF_ERRPASS(!unpkarc, NULL);

    if (!mvlLoadEntries(io, count, unpkarc))
    {
        UNPK_abandonArchive(unpkarc);
        return NULL;
    } /* if */

    return unpkarc;
}